

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::objUnscaled(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  int local_28;
  bool local_24;
  undefined8 local_20;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  if (this->_isScaled == true) {
    (*this->lp_scaler->_vptr_SPxScaler[0x18])(&local_50,this->lp_scaler,this);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) = local_30;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = local_40;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uStack_38;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_50;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uStack_48;
    (__return_storage_ptr__->m_backend).exp = local_28;
    (__return_storage_ptr__->m_backend).neg = local_24;
    (__return_storage_ptr__->m_backend).fpclass = (undefined4)local_20;
    (__return_storage_ptr__->m_backend).prec_elem = local_20._4_4_;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&__return_storage_ptr__->m_backend,
               &(this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
  }
  if (this->thesense == MINIMIZE) {
    boost::multiprecision::backends::eval_multiply<50u,int,void>
              (&__return_storage_ptr__->m_backend,-1);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxLPBase<R>::objUnscaled(int i) const
{
   assert(i >= 0 && i < nCols());
   R res;

   if(_isScaled)
   {
      res = lp_scaler->maxObjUnscaled(*this, i);
   }
   else
   {
      res = maxObj(i);
   }

   if(spxSense() == MINIMIZE)
      res *= -1;

   return res;
}